

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_interpolate_node(REF_GRID ref_grid,REF_INT node)

{
  REF_MPI pRVar1;
  REF_INTERP ref_interp_00;
  REF_NODE ref_node;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_raise;
  REF_INT nodes [27];
  int local_160;
  int local_15c;
  REF_INT im;
  REF_INT ibary;
  REF_DBL bary [4];
  REF_DBL log_m [6];
  REF_DBL log_parent_m [4] [6];
  REF_CELL from_cell;
  REF_NODE from_node;
  REF_GRID from_grid;
  REF_INTERP ref_interp;
  REF_MPI ref_mpi;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->mpi;
  if (ref_grid->interp == (REF_INTERP)0x0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    ref_interp_00 = ref_grid->interp;
    ref_node = ref_interp_00->from_grid->node;
    if (ref_interp_00->from_grid->twod == 0) {
      log_parent_m[3][5] = (REF_DBL)ref_interp_00->from_tet;
    }
    else {
      log_parent_m[3][5] = (REF_DBL)ref_interp_00->from_tri;
    }
    if (ref_interp_00->continuously == 0) {
      ref_interp_00->cell[node] = -1;
      ref_grid_local._4_4_ = 0;
    }
    else {
      ref_grid_local._4_4_ = ref_interp_locate_node(ref_interp_00,node);
      if (ref_grid_local._4_4_ == 0) {
        if ((ref_interp_00->cell[node] == -1) || (pRVar1->id != ref_interp_00->part[node])) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          ref_grid_local._4_4_ =
               ref_cell_nodes((REF_CELL)log_parent_m[3][5],ref_interp_00->cell[node],
                              &ref_private_macro_code_rss);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ =
                 ref_node_clip_bary4(ref_interp_00->bary + (node << 2),(REF_DBL *)&im);
            if (ref_grid_local._4_4_ == 0) {
              for (local_15c = 0; local_15c < *(int *)((long)log_parent_m[3][5] + 0xc);
                  local_15c = local_15c + 1) {
                uVar2 = ref_node_metric_get_log
                                  (ref_node,(&ref_private_macro_code_rss)[local_15c],
                                   log_parent_m[(long)local_15c + -1] + 5);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x1fc,"ref_metric_interpolate_node",(ulong)uVar2,"log(parentM)");
                  return uVar2;
                }
              }
              for (local_160 = 0; local_160 < 6; local_160 = local_160 + 1) {
                bary[(long)local_160 + 3] = 0.0;
              }
              for (local_160 = 0; local_160 < 6; local_160 = local_160 + 1) {
                for (local_15c = 0; local_15c < *(int *)((long)log_parent_m[3][5] + 0xc);
                    local_15c = local_15c + 1) {
                  bary[(long)local_160 + 3] =
                       *(double *)(&im + (long)local_15c * 2) *
                       log_parent_m[(long)local_15c + -1][(long)local_160 + 5] +
                       bary[(long)local_160 + 3];
                }
              }
              ref_grid_local._4_4_ = ref_node_metric_set_log(ref_grid->node,node,bary + 3);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x204,"ref_metric_interpolate_node",(ulong)ref_grid_local._4_4_,
                       "set interp log met");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x1f9,"ref_metric_interpolate_node",(ulong)ref_grid_local._4_4_,"clip");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x1f8,"ref_metric_interpolate_node",(ulong)ref_grid_local._4_4_,
                   "node needs to be localized");
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate_node(REF_GRID ref_grid,
                                               REF_INT node) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE from_node;
  REF_CELL from_cell;
  REF_DBL log_parent_m[4][6], log_m[6], bary[4];
  REF_INT ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == ref_grid_interp(ref_grid)) {
    return REF_SUCCESS;
  }

  ref_interp = ref_grid_interp(ref_grid);
  from_grid = ref_interp_from_grid(ref_interp);
  from_node = ref_grid_node(from_grid);
  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  if (!ref_interp_continuously(ref_interp)) {
    ref_interp_cell(ref_interp, node) = REF_EMPTY; /* mark moved */
    return REF_SUCCESS;
  }

  RAISE(ref_interp_locate_node(ref_interp, node));

  /* location unsuccessful */
  if (REF_EMPTY == ref_interp_cell(ref_interp, node) ||
      ref_mpi_rank(ref_mpi) != ref_interp->part[node])
    return REF_SUCCESS;
  RSS(ref_cell_nodes(from_cell, ref_interp_cell(ref_interp, node), nodes),
      "node needs to be localized");
  RSS(ref_node_clip_bary4(&ref_interp_bary(ref_interp, 0, node), bary), "clip");
  for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++)
    RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
        "log(parentM)");
  for (im = 0; im < 6; im++) log_m[im] = 0.0;
  for (im = 0; im < 6; im++) {
    for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
      log_m[im] += bary[ibary] * log_parent_m[ibary][im];
    }
  }
  RSS(ref_node_metric_set_log(ref_grid_node(ref_grid), node, log_m),
      "set interp log met");

  return REF_SUCCESS;
}